

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O0

BaseType_conflict
Imath_3_2::(anonymous_namespace)::maxOffDiagSymm<Imath_3_2::Matrix33<double>>(Matrix33<double> *A)

{
  uint uVar1;
  uint uVar2;
  double *pdVar3;
  Matrix33<double> *in_RDI;
  Matrix33<double> *pMVar4;
  uint j;
  uint i;
  T result;
  double local_20;
  uint local_18;
  uint local_14;
  double local_10;
  Matrix33<double> *local_8;
  
  local_10 = 0.0;
  local_8 = in_RDI;
  for (local_14 = 0; uVar1 = local_14, uVar2 = Matrix33<double>::dimensions(), local_18 = local_14,
      uVar1 < uVar2; local_14 = local_14 + 1) {
    while( true ) {
      local_18 = local_18 + 1;
      uVar1 = local_18;
      uVar2 = Matrix33<double>::dimensions();
      if (uVar2 <= uVar1) break;
      pMVar4 = local_8;
      Matrix33<double>::operator[](local_8,local_14);
      std::abs((int)pMVar4);
      pdVar3 = std::max<double>(&local_10,&local_20);
      local_10 = *pdVar3;
    }
  }
  return local_10;
}

Assistant:

IMATH_CONSTEXPR14 inline typename TM::BaseType
maxOffDiagSymm (const TM& A)
{
    typedef typename TM::BaseType T;
    T                             result = 0;
    for (unsigned int i = 0; i < TM::dimensions (); ++i)
        for (unsigned int j = i + 1; j < TM::dimensions (); ++j)
            result = std::max (result, std::abs (A[i][j]));

    return result;
}